

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
flatbuffers::NewSwiftCodeGenerator(void)

{
  SwiftCodeGenerator *this;
  __uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
  in_RDI;
  unique_ptr<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>_>
  local_18 [2];
  
  this = (SwiftCodeGenerator *)operator_new(0x28);
  memset(this,0,0x28);
  anon_unknown_35::SwiftCodeGenerator::SwiftCodeGenerator(this);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>>
  ::unique_ptr<std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>,void>
            ((unique_ptr<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>>
              *)local_18,this);
  std::unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>::
  unique_ptr<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>,void>
            ((unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>
              *)in_RDI.
                super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
                .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl,local_18);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::SwiftCodeGenerator>_>
  ::~unique_ptr(local_18);
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(tuple<flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>)
           in_RDI.
           super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
           .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CodeGenerator> NewSwiftCodeGenerator() {
  return std::unique_ptr<SwiftCodeGenerator>(new SwiftCodeGenerator());
}